

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ostream *poVar1;
  
  if (this->m_atLeastOneTestCasePrinted == true) {
    printTotalsDivider(this);
  }
  printTotals(this,&_testRunStats->totals);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            if( m_atLeastOneTestCasePrinted )
                printTotalsDivider();
            printTotals( _testRunStats.totals );
            stream << "\n" << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }